

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fShaderHelperInvocationTests.cpp
# Opt level: O0

void deqp::gles31::Functional::anon_unknown_1::drawRandomPrimitives
               (RenderContext *renderCtx,deUint32 program,PrimitiveType primType,int numPrimitives,
               Random *rnd)

{
  pointer *ppVVar1;
  int iVar2;
  PrimitiveType type_;
  undefined4 extraout_var;
  size_type sVar3;
  reference data;
  reference vertexArrays_00;
  size_type sVar4;
  float fVar5;
  float fVar6;
  float local_160;
  PrimitiveList local_130;
  float local_114;
  float lineWidth;
  Vec2 range_1;
  int pointSizeLoc;
  float pointSize;
  bool isWidePoint;
  Vec2 range;
  VertexArrayBinding local_d0;
  undefined1 local_70 [8];
  vector<glu::VertexArrayBinding,_std::allocator<glu::VertexArrayBinding>_> vertexArrays;
  vector<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_> vertices;
  float maxLineWidth;
  float minLineWidth;
  float maxPointSize;
  float minPointSize;
  Functions *gl;
  Random *rnd_local;
  int numPrimitives_local;
  PrimitiveType primType_local;
  deUint32 program_local;
  RenderContext *renderCtx_local;
  Functions *gl_00;
  
  iVar2 = (*renderCtx->_vptr_RenderContext[3])();
  gl_00 = (Functions *)CONCAT44(extraout_var,iVar2);
  ppVVar1 = &vertexArrays.
             super__Vector_base<glu::VertexArrayBinding,_std::allocator<glu::VertexArrayBinding>_>.
             _M_impl.super__Vector_impl_data._M_end_of_storage;
  std::vector<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>::vector
            ((vector<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_> *)ppVVar1);
  std::vector<glu::VertexArrayBinding,_std::allocator<glu::VertexArrayBinding>_>::vector
            ((vector<glu::VertexArrayBinding,_std::allocator<glu::VertexArrayBinding>_> *)local_70);
  genVertices(primType,numPrimitives,rnd,
              (vector<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_> *)ppVVar1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)(range.m_data + 1),"a_position",(allocator<char> *)((long)range.m_data + 3));
  ppVVar1 = &vertexArrays.
             super__Vector_base<glu::VertexArrayBinding,_std::allocator<glu::VertexArrayBinding>_>.
             _M_impl.super__Vector_impl_data._M_end_of_storage;
  sVar3 = std::vector<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>::size
                    ((vector<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_> *)
                     ppVVar1);
  data = std::vector<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>::operator[]
                   ((vector<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_> *)
                    ppVVar1,0);
  glu::va::Float(&local_d0,(string *)(range.m_data + 1),2,(int)sVar3,0,data->m_data);
  std::vector<glu::VertexArrayBinding,_std::allocator<glu::VertexArrayBinding>_>::push_back
            ((vector<glu::VertexArrayBinding,_std::allocator<glu::VertexArrayBinding>_> *)local_70,
             &local_d0);
  glu::VertexArrayBinding::~VertexArrayBinding(&local_d0);
  std::__cxx11::string::~string((string *)(range.m_data + 1));
  std::allocator<char>::~allocator((allocator<char> *)((long)range.m_data + 3));
  (*gl_00->useProgram)(program);
  if ((primType == PRIMITIVETYPE_POINT) || (primType == PRIMITIVETYPE_WIDE_POINT)) {
    getRange((anon_unknown_1 *)&pointSize,gl_00,0x846d);
    if (primType == PRIMITIVETYPE_WIDE_POINT) {
      fVar5 = de::Random::getFloat(rnd,16.0,32.0);
      fVar6 = tcu::Vector<float,_2>::y((Vector<float,_2> *)&pointSize);
      local_160 = de::min<float>(fVar5,fVar6);
    }
    else {
      local_160 = 1.0;
    }
    range_1.m_data[1] = local_160;
    range_1.m_data[0] = (float)(*gl_00->getUniformLocation)(program,"u_pointSize");
    (*gl_00->uniform1f)((GLint)range_1.m_data[0],range_1.m_data[1]);
  }
  else if (primType == PRIMITIVETYPE_WIDE_LINE) {
    getRange((anon_unknown_1 *)&stack0xfffffffffffffef0,gl_00,0x846e);
    fVar5 = de::Random::getFloat(rnd,16.0,32.0);
    fVar6 = tcu::Vector<float,_2>::y((Vector<float,_2> *)&stack0xfffffffffffffef0);
    local_114 = de::min<float>(fVar5,fVar6);
    (*gl_00->lineWidth)(local_114);
  }
  sVar3 = std::vector<glu::VertexArrayBinding,_std::allocator<glu::VertexArrayBinding>_>::size
                    ((vector<glu::VertexArrayBinding,_std::allocator<glu::VertexArrayBinding>_> *)
                     local_70);
  vertexArrays_00 =
       std::vector<glu::VertexArrayBinding,_std::allocator<glu::VertexArrayBinding>_>::operator[]
                 ((vector<glu::VertexArrayBinding,_std::allocator<glu::VertexArrayBinding>_> *)
                  local_70,0);
  type_ = getGluPrimitiveType(primType);
  sVar4 = std::vector<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>::size
                    ((vector<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_> *)
                     &vertexArrays.
                      super__Vector_base<glu::VertexArrayBinding,_std::allocator<glu::VertexArrayBinding>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage);
  glu::PrimitiveList::PrimitiveList(&local_130,type_,(int)sVar4);
  glu::draw(renderCtx,program,(int)sVar3,vertexArrays_00,&local_130,(DrawUtilCallback *)0x0);
  std::vector<glu::VertexArrayBinding,_std::allocator<glu::VertexArrayBinding>_>::~vector
            ((vector<glu::VertexArrayBinding,_std::allocator<glu::VertexArrayBinding>_> *)local_70);
  std::vector<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>::~vector
            ((vector<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_> *)
             &vertexArrays.
              super__Vector_base<glu::VertexArrayBinding,_std::allocator<glu::VertexArrayBinding>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage);
  return;
}

Assistant:

static void drawRandomPrimitives (const glu::RenderContext& renderCtx, deUint32 program, PrimitiveType primType, int numPrimitives, de::Random* rnd)
{
	const glw::Functions&			gl				= renderCtx.getFunctions();
	const float						minPointSize	= 16.0f;
	const float						maxPointSize	= 32.0f;
	const float						minLineWidth	= 16.0f;
	const float						maxLineWidth	= 32.0f;
	vector<Vec2>					vertices;
	vector<glu::VertexArrayBinding>	vertexArrays;

	genVertices(primType, numPrimitives, rnd, &vertices);

	vertexArrays.push_back(glu::va::Float("a_position", 2, (int)vertices.size(), 0, (const float*)&vertices[0]));

	gl.useProgram(program);

	// Special state for certain primitives
	if (primType == PRIMITIVETYPE_POINT || primType == PRIMITIVETYPE_WIDE_POINT)
	{
		const Vec2		range			= getRange(gl, GL_ALIASED_POINT_SIZE_RANGE);
		const bool		isWidePoint		= primType == PRIMITIVETYPE_WIDE_POINT;
		const float		pointSize		= isWidePoint ? de::min(rnd->getFloat(minPointSize, maxPointSize), range.y()) : 1.0f;
		const int		pointSizeLoc	= gl.getUniformLocation(program, "u_pointSize");

		gl.uniform1f(pointSizeLoc, pointSize);
	}
	else if (primType == PRIMITIVETYPE_WIDE_LINE)
	{
		const Vec2		range			= getRange(gl, GL_ALIASED_LINE_WIDTH_RANGE);
		const float		lineWidth		= de::min(rnd->getFloat(minLineWidth, maxLineWidth), range.y());

		gl.lineWidth(lineWidth);
	}

	glu::draw(renderCtx, program, (int)vertexArrays.size(), &vertexArrays[0],
			  glu::PrimitiveList(getGluPrimitiveType(primType), (int)vertices.size()));
}